

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O3

bool __thiscall NewChangeDot::CreateDirsWithHashTitle(NewChangeDot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer pbVar3;
  long lVar4;
  pointer pcVar5;
  char cVar6;
  long *plVar7;
  Logger *pLVar8;
  Tools *this_00;
  undefined8 uVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  ofstream file;
  ifstream dir;
  long *local_618;
  long local_610;
  long local_608;
  long lStack_600;
  allocator<char> local_5f5;
  uint local_5f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  long *local_5d0;
  long local_5c8;
  long local_5c0;
  long lStack_5b8;
  string local_5b0;
  long *local_590;
  long local_588;
  long local_580;
  long lStack_578;
  string local_570;
  string local_550;
  long *local_530 [2];
  long local_520 [2];
  long *local_510 [2];
  long local_500 [2];
  long *local_4f0 [2];
  long local_4e0 [2];
  long *local_4d0 [2];
  long local_4c0 [2];
  undefined8 local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a8;
  string *local_4a0;
  string local_498;
  string local_478;
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438 [8];
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  byte abStack_418 [216];
  ios_base local_340 [264];
  string local_238 [520];
  
  std::ifstream::ifstream(local_238);
  if ((this->
      super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->
      super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_4a0 = (string *)
                &(this->
                 super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).shortHashName;
    paVar1 = &local_5f0.field_2;
    local_4a8 = _VTT;
    local_4b0 = _memcpy;
    local_5f4 = (uint)CONCAT71((int7)((ulong)_memcpy >> 8),1);
    lVar14 = 0;
    uVar15 = 0;
    do {
      pvVar2 = (this->
               super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ).hashNames;
      pbVar3 = (pvVar2->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pvVar2->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar15)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15);
        goto LAB_0010791e;
      }
      std::__cxx11::string::substr((ulong)local_438,(long)&(pbVar3->_M_dataplus)._M_p + lVar14);
      std::__cxx11::string::operator=(local_4a0,(string *)local_438);
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,
                 (((this->
                   super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).path)->_M_dataplus)._M_p,(allocator<char> *)&local_5d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_5f0);
      local_618 = &local_608;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_608 = *plVar10;
        lStack_600 = plVar7[3];
      }
      else {
        local_608 = *plVar10;
        local_618 = (long *)*plVar7;
      }
      local_610 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_618,
                                  (ulong)(this->
                                         super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ).shortHashName._M_dataplus._M_p);
      local_438 = (undefined1  [8])&local_428;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar11) {
        local_428._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_428._8_8_ = plVar7[3];
      }
      else {
        local_428._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_438 = (undefined1  [8])*plVar7;
      }
      local_430 = plVar7[1];
      *plVar7 = (long)paVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::ifstream::open(local_238,(_Ios_Openmode)local_438);
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618,local_608 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      cVar6 = std::__basic_file<char>::is_open();
      if (cVar6 != '\0') {
        pbVar3 = (this->
                 super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar15 < (ulong)((long)(this->
                                   super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ).files.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5))
        {
          local_510[0] = local_500;
          lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar14);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,lVar4,
                     *(long *)((long)&pbVar3->_M_string_length + lVar14) + lVar4);
          local_4d0[0] = local_4c0;
          pcVar5 = (this->
                   super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).shortHashName._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d0,pcVar5,
                     pcVar5 + (this->
                              super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ).shortHashName._M_string_length);
          (*(this->
            super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._vptr_NewChangeBase[2])(this,local_510,(string *)local_4d0);
          if (local_4d0[0] != local_4c0) {
            operator_delete(local_4d0[0],local_4c0[0] + 1);
          }
          if (local_510[0] != local_500) {
            operator_delete(local_510[0],local_500[0] + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_458,
                     (((this->
                       super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ).path)->_M_dataplus)._M_p,&local_5f5);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_458);
          local_590 = &local_580;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_580 = *plVar10;
            lStack_578 = plVar7[3];
          }
          else {
            local_580 = *plVar10;
            local_590 = (long *)*plVar7;
          }
          local_588 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_590,
                                      (ulong)(this->
                                             super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ).shortHashName._M_dataplus._M_p);
          local_5d0 = &local_5c0;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_5c0 = *plVar10;
            lStack_5b8 = plVar7[3];
          }
          else {
            local_5c0 = *plVar10;
            local_5d0 = (long *)*plVar7;
          }
          local_5c8 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_5d0);
          psVar12 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_5f0.field_2._M_allocated_capacity = *psVar12;
            local_5f0.field_2._8_8_ = plVar7[3];
            local_5f0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_5f0.field_2._M_allocated_capacity = *psVar12;
            local_5f0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_5f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_5f0,
                                      (ulong)(this->
                                             super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ).shortHashName._M_dataplus._M_p);
          local_618 = &local_608;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_608 = *plVar10;
            lStack_600 = plVar7[3];
          }
          else {
            local_608 = *plVar10;
            local_618 = (long *)*plVar7;
          }
          local_610 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::ofstream::ofstream(local_438,(string *)&local_618,_S_out);
          if (local_618 != &local_608) {
            operator_delete(local_618,local_608 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
          }
          if (local_5d0 != &local_5c0) {
            operator_delete(local_5d0,local_5c0 + 1);
          }
          if (local_590 != &local_580) {
            operator_delete(local_590,local_580 + 1);
          }
          if (local_458[0] != local_448) {
            operator_delete(local_458[0],local_448[0] + 1);
          }
          if ((abStack_418[*(long *)((long)local_438 + -0x18)] & 5) != 0) {
            pLVar8 = Logger::getInstance();
            pbVar3 = (this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->
                              super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ).files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
                uVar15) goto LAB_00107962;
            std::operator+(&local_5f0,"file ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(pbVar3->_M_dataplus)._M_p + lVar14));
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_5f0);
            local_618 = &local_608;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_608 = *plVar10;
              lStack_600 = plVar7[3];
            }
            else {
              local_608 = *plVar10;
              local_618 = (long *)*plVar7;
            }
            local_610 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_618,
                                        (ulong)(this->
                                               super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ).shortHashName._M_dataplus._M_p);
            local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
            psVar12 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_5b0.field_2._M_allocated_capacity = *psVar12;
              local_5b0.field_2._8_8_ = plVar7[3];
            }
            else {
              local_5b0.field_2._M_allocated_capacity = *psVar12;
              local_5b0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_5b0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            Logger::LogError(pLVar8,&local_5b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
              operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_618 != &local_608) {
              operator_delete(local_618,local_608 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f0._M_dataplus._M_p != paVar1) {
              operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pvVar2 = (this->
                   super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).hashNames;
          pbVar3 = (pvVar2->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar15 < (ulong)((long)(pvVar2->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5
                              )) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_438,*(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar14),
                       *(long *)((long)&pbVar3->_M_string_length + lVar14));
            pbVar3 = (this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->
                              super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ).files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
                uVar15) goto LAB_0010791e;
            local_530[0] = local_520;
            lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar14);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_530,lVar4,
                       *(long *)((long)&pbVar3->_M_string_length + lVar14) + lVar4);
            this_00 = Tools::getInstance();
            pbVar3 = (this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar15 < (ulong)((long)(this->
                                       super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ).files.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >>
                                5)) {
              local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
              lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar14);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_550,lVar4,
                         *(long *)((long)&pbVar3->_M_string_length + lVar14) + lVar4);
              Tools::GetFileString(&local_498,this_00,&local_550);
              local_4f0[0] = local_4e0;
              pcVar5 = (this->
                       super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ).shortHashName._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_4f0,pcVar5,
                         pcVar5 + (this->
                                  super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ).shortHashName._M_string_length);
              (*(this->
                super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._vptr_NewChangeBase[3])(this,local_530,&local_498,(string *)local_4f0);
              if (local_4f0[0] != local_4e0) {
                operator_delete(local_4f0[0],local_4e0[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p != &local_550.field_2) {
                operator_delete(local_550._M_dataplus._M_p,
                                local_550.field_2._M_allocated_capacity + 1);
              }
              if (local_530[0] != local_520) {
                operator_delete(local_530[0],local_520[0] + 1);
              }
              local_438 = (undefined1  [8])local_4a8;
              *(undefined8 *)(local_438 + *(long *)(local_4a8->_M_local_buf + -0x18)) = local_4b0;
              std::filebuf::~filebuf((filebuf *)&local_430);
              std::ios_base::~ios_base(local_340);
              goto LAB_0010785a;
            }
          }
          else {
LAB_0010791e:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar15);
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar15);
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15);
LAB_00107951:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15);
LAB_00107962:
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != paVar1) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar9);
      }
      pLVar8 = Logger::getInstance();
      pbVar3 = (this->
               super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ).files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->
                        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ).files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar15)
      goto LAB_00107951;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                     "Directory ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar3->_M_dataplus)._M_p + lVar14));
      plVar7 = (long *)std::__cxx11::string::append((char *)local_438);
      local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_570.field_2._M_allocated_capacity = *psVar12;
        local_570.field_2._8_8_ = plVar7[3];
      }
      else {
        local_570.field_2._M_allocated_capacity = *psVar12;
        local_570._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_570._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Logger::LogError(pLVar8,&local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
      }
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
      }
      local_5f4 = 0;
LAB_0010785a:
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar15 < (ulong)((long)(this->
                                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ).files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ).files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if ((local_5f4 & 1) == 0) {
      bVar13 = false;
      goto LAB_001078df;
    }
  }
  pLVar8 = Logger::getInstance();
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_478,"Directory created successfully","");
  Logger::LogInformation(pLVar8,&local_478);
  bVar13 = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
LAB_001078df:
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return bVar13;
}

Assistant:

virtual bool CreateDirsWithHashTitle() override {
        ifstream dir;
        bool isCreated = true;

        for (int i = 0; i < this->files.size(); i++) {
            this->shortHashName = this->hashNames->at(i).substr(0, 6);
            dir.open(string(this->path->data()) + "/objects/" + this->shortHashName);
            if (!dir.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + this->files.at(i) + " didn't create");
                isCreated = false;
            } else {
                WriteInIndexFile(this->files.at(i), this->shortHashName);
                ofstream file(string(this->path->data()) + "/objects/" + this->shortHashName + "/" +
                              this->shortHashName);
                if (!file) {
                    Logger::getInstance()->LogError(
                            "file " + this->files.at(i) + " didn't add in " + this->shortHashName);
                }
                file << this->hashNames->at(i);
                AddOldVersion(this->files.at(i), Tools::getInstance()->GetFileString(this->files.at(i)),
                              this->shortHashName);
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directory created successfully");
        }

        dir.close();

        return isCreated;
    }